

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr.h
# Opt level: O0

_Bool xdr_putuint32(XDR *xdrs,uint32_t v)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint8_t *future;
  uint32_t v_local;
  XDR *xdrs_local;
  
  puVar1 = xdrs->x_data;
  if ((xdrs->x_v).vio_wrap < puVar1 + 4) {
    xdrs_local._7_1_ = (*xdrs->x_ops->x_putunit)(xdrs,v);
  }
  else {
    uVar2 = htonl(v);
    *(uint32_t *)xdrs->x_data = uVar2;
    xdrs->x_data = puVar1 + 4;
    xdrs_local._7_1_ = true;
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_putuint32(XDR *xdrs, uint32_t v)
{
	uint8_t *future = xdrs->x_data + sizeof(uint32_t);

	if (future <= xdrs->x_v.vio_wrap) {
		*((int32_t *) (xdrs->x_data)) = htonl(v);
		xdrs->x_data = future;
		return (true);
	}
	return (*xdrs->x_ops->x_putunit)(xdrs, v);
}